

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_ldrddi.cpp
# Opt level: O1

ze_result_t
loader::zeCommandListAppendImageCopyRegion
          (ze_command_list_handle_t hCommandList,ze_image_handle_t hDstImage,
          ze_image_handle_t hSrcImage,ze_image_region_t *pDstRegion,ze_image_region_t *pSrcRegion,
          ze_event_handle_t hSignalEvent,uint32_t numWaitEvents,ze_event_handle_t *phWaitEvents)

{
  code *pcVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  ze_result_t zVar5;
  void *pvVar6;
  ulong uVar7;
  bool bVar8;
  undefined8 local_50;
  
  pcVar1 = *(code **)(*(long *)(hCommandList + 8) + 0x278);
  if (pcVar1 == (code *)0x0) {
    zVar5 = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  else {
    if (hSignalEvent == (ze_event_handle_t)0x0) {
      local_50 = 0;
    }
    else {
      local_50 = *(undefined8 *)hSignalEvent;
    }
    uVar2 = *(undefined8 *)hCommandList;
    uVar3 = *(undefined8 *)hDstImage;
    uVar4 = *(undefined8 *)hSrcImage;
    pvVar6 = operator_new__((ulong)numWaitEvents * 8);
    if (numWaitEvents != 0 && phWaitEvents != (ze_event_handle_t *)0x0) {
      uVar7 = 1;
      do {
        *(undefined8 *)((long)pvVar6 + uVar7 * 8 + -8) = *(undefined8 *)phWaitEvents[uVar7 - 1];
        if (phWaitEvents == (ze_event_handle_t *)0x0) break;
        bVar8 = uVar7 < numWaitEvents;
        uVar7 = uVar7 + 1;
      } while (bVar8);
    }
    zVar5 = (*pcVar1)(uVar2,uVar3,uVar4,pDstRegion,pSrcRegion,local_50,numWaitEvents,pvVar6);
    operator_delete__(pvVar6);
  }
  return zVar5;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeCommandListAppendImageCopyRegion(
        ze_command_list_handle_t hCommandList,          ///< [in] handle of command list
        ze_image_handle_t hDstImage,                    ///< [in] handle of destination image to copy to
        ze_image_handle_t hSrcImage,                    ///< [in] handle of source image to copy from
        const ze_image_region_t* pDstRegion,            ///< [in][optional] destination region descriptor
        const ze_image_region_t* pSrcRegion,            ///< [in][optional] source region descriptor
        ze_event_handle_t hSignalEvent,                 ///< [in][optional] handle of the event to signal on completion
        uint32_t numWaitEvents,                         ///< [in][optional] number of events to wait on before launching; must be 0
                                                        ///< if `nullptr == phWaitEvents`
        ze_event_handle_t* phWaitEvents                 ///< [in][optional][range(0, numWaitEvents)] handle of the events to wait
                                                        ///< on before launching
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // extract driver's function pointer table
        auto dditable = reinterpret_cast<ze_command_list_object_t*>( hCommandList )->dditable;
        auto pfnAppendImageCopyRegion = dditable->ze.CommandList.pfnAppendImageCopyRegion;
        if( nullptr == pfnAppendImageCopyRegion )
            return ZE_RESULT_ERROR_UNINITIALIZED;

        // convert loader handle to driver handle
        hCommandList = reinterpret_cast<ze_command_list_object_t*>( hCommandList )->handle;

        // convert loader handle to driver handle
        hDstImage = reinterpret_cast<ze_image_object_t*>( hDstImage )->handle;

        // convert loader handle to driver handle
        hSrcImage = reinterpret_cast<ze_image_object_t*>( hSrcImage )->handle;

        // convert loader handle to driver handle
        hSignalEvent = ( hSignalEvent ) ? reinterpret_cast<ze_event_object_t*>( hSignalEvent )->handle : nullptr;

        // convert loader handles to driver handles
        auto phWaitEventsLocal = new ze_event_handle_t [numWaitEvents];
        for( size_t i = 0; ( nullptr != phWaitEvents ) && ( i < numWaitEvents ); ++i )
            phWaitEventsLocal[ i ] = reinterpret_cast<ze_event_object_t*>( phWaitEvents[ i ] )->handle;

        // forward to device-driver
        result = pfnAppendImageCopyRegion( hCommandList, hDstImage, hSrcImage, pDstRegion, pSrcRegion, hSignalEvent, numWaitEvents, phWaitEventsLocal );
        delete []phWaitEventsLocal;

        return result;
    }